

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

int64_t __thiscall llvm::APInt::srem(APInt *this,int64_t RHS)

{
  anon_union_8_2_1313ab2f_for_U aVar1;
  uint uVar2;
  bool bVar3;
  uint64_t uVar4;
  ulong uVar5;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  anon_union_8_2_1313ab2f_for_U local_28;
  uint local_20;
  
  bVar3 = operator[](this,this->BitWidth - 1);
  if (!bVar3) {
    if (RHS < 0) {
      RHS = -RHS;
    }
    uVar4 = urem(this,RHS);
    return uVar4;
  }
  if (RHS < 0) {
    local_30 = this->BitWidth;
    if ((ulong)local_30 < 0x41) {
      local_38 = this->U;
    }
    else {
      uVar5 = (ulong)((uint)((ulong)local_30 + 0x3f >> 3) & 0xfffffff8);
      local_38.pVal = (uint64_t *)operator_new__(uVar5);
      memcpy(local_38.pVal,(this->U).pVal,uVar5);
    }
    flipAllBits((APInt *)&local_38);
    operator++((APInt *)&local_38);
    local_20 = local_30;
    local_28.VAL = local_38.VAL;
    local_30 = 0;
    uVar4 = urem((APInt *)&local_28,-RHS);
    aVar1 = local_38;
    uVar2 = local_30;
    if ((0x40 < local_20) && (local_28.VAL != 0)) {
      operator_delete__(local_28.pVal);
      aVar1 = local_38;
      uVar2 = local_30;
    }
  }
  else {
    local_40 = this->BitWidth;
    if ((ulong)local_40 < 0x41) {
      local_48 = this->U;
    }
    else {
      uVar5 = (ulong)((uint)((ulong)local_40 + 0x3f >> 3) & 0xfffffff8);
      local_48.pVal = (uint64_t *)operator_new__(uVar5);
      memcpy(local_48.pVal,(this->U).pVal,uVar5);
    }
    flipAllBits((APInt *)&local_48);
    operator++((APInt *)&local_48);
    local_20 = local_40;
    local_28.VAL = local_48.VAL;
    local_40 = 0;
    uVar4 = urem((APInt *)&local_28,RHS);
    aVar1 = local_48;
    uVar2 = local_40;
    if ((0x40 < local_20) && (local_28.VAL != 0)) {
      operator_delete__(local_28.pVal);
      aVar1 = local_48;
      uVar2 = local_40;
    }
  }
  if ((0x40 < uVar2) && ((void *)aVar1.VAL != (void *)0x0)) {
    operator_delete__(aVar1.pVal);
  }
  return -uVar4;
}

Assistant:

int64_t APInt::srem(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return -((-(*this)).urem(-RHS));
    return -((-(*this)).urem(RHS));
  }
  if (RHS < 0)
    return this->urem(-RHS);
  return this->urem(RHS);
}